

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

size_t scriptint_to_bytes(int64_t signed_v,uchar *bytes_out)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = -signed_v;
  if (0 < signed_v) {
    uVar2 = signed_v;
  }
  sVar1 = 0;
  uVar3 = 0;
  for (; uVar2 != 0; uVar2 = uVar2 >> 8) {
    uVar3 = uVar2 & 0xffffffff;
    bytes_out[sVar1] = (uchar)uVar2;
    sVar1 = sVar1 + 1;
  }
  if (-1 < (char)uVar3) {
    if (-1 < signed_v) {
      return sVar1;
    }
    bytes_out[sVar1 - 1] = bytes_out[sVar1 - 1] | 0x80;
    return sVar1;
  }
  bytes_out[sVar1] = (byte)((ulong)signed_v >> 0x38) & 0x80;
  return sVar1 + 1;
}

Assistant:

size_t scriptint_to_bytes(int64_t signed_v, unsigned char *bytes_out)
{
    uint64_t v = signed_v < 0 ? -signed_v : signed_v;
    size_t len = 0;
    unsigned char last = 0;

    while (v) {
        last = v & 0xff;
        *bytes_out++ = last;
        len += 1;
        v >>= 8;
    }
    if (last & 0x80) {
        *bytes_out = signed_v < 0 ? 0x80 : 0;
        ++len;
    } else if (signed_v < 0)
        bytes_out[-1] |= 0x80;
    return len;
}